

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

uint32 lzham::lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)

{
  long in_RDI;
  uint32 adler32;
  lzham_decompressor *pState;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = *(uint32 *)(in_RDI + 0x548);
    lzham_delete_array<unsigned_char>((uchar *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
    lzham_delete<lzham::lzham_decompressor>((lzham_decompressor *)0x12506f);
  }
  return local_4;
}

Assistant:

uint32 lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);
      if (!pState)
         return 0;

      uint32 adler32 = pState->m_decomp_adler32;

      lzham_delete_array(pState->m_pRaw_decomp_buf);
      lzham_delete(pState);

      return adler32;
   }